

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O3

void Ivy_ObjUpdateLevelR_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj,int ReqNew)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  Ivy_Obj_t *pObj_00;
  
  if (pObj->Id != 0) {
    while (uVar3 = *(uint *)&pObj->field_0x8 & 0xf, uVar3 - 5 < 3) {
      pObj_00 = (Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      iVar1 = pObj_00->Id;
      lVar4 = (long)iVar1;
      if ((lVar4 < 0) || (p->vRequired->nSize <= iVar1)) {
LAB_007fcfe9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = p->vRequired->pArray;
      iVar1 = ReqNew + -1;
      if (ReqNew <= piVar2[lVar4]) {
        piVar2[lVar4] = iVar1;
        Ivy_ObjUpdateLevelR_rec(p,pObj_00,iVar1);
        uVar3 = *(uint *)&pObj->field_0x8 & 0xf;
      }
      if (uVar3 == 7) {
        return;
      }
      pObj = (Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      lVar4 = (long)pObj->Id;
      if ((lVar4 < 0) || (p->vRequired->nSize <= pObj->Id)) goto LAB_007fcfe9;
      piVar2 = p->vRequired->pArray;
      if (piVar2[lVar4] < ReqNew) {
        return;
      }
      piVar2[lVar4] = iVar1;
      ReqNew = iVar1;
      if (pObj->Id == 0) {
        return;
      }
    }
    if ((uVar3 != 1) && (uVar3 != 4)) {
      __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                    ,0x1c1,"void Ivy_ObjUpdateLevelR_rec(Ivy_Man_t *, Ivy_Obj_t *, int)");
    }
  }
  return;
}

Assistant:

void Ivy_ObjUpdateLevelR_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, int ReqNew )
{
    Ivy_Obj_t * pFanin;
    if ( Ivy_ObjIsConst1(pObj) || Ivy_ObjIsCi(pObj) )
        return;
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    // process the first fanin
    pFanin = Ivy_ObjFanin0(pObj);
    if ( Vec_IntEntry(p->vRequired, pFanin->Id) > ReqNew - 1 )
    {
        Vec_IntWriteEntry( p->vRequired, pFanin->Id, ReqNew - 1 );
        Ivy_ObjUpdateLevelR_rec( p, pFanin, ReqNew - 1 );
    }
    if ( Ivy_ObjIsBuf(pObj) )
        return;
    // process the second fanin
    pFanin = Ivy_ObjFanin1(pObj);
    if ( Vec_IntEntry(p->vRequired, pFanin->Id) > ReqNew - 1 )
    {
        Vec_IntWriteEntry( p->vRequired, pFanin->Id, ReqNew - 1 );
        Ivy_ObjUpdateLevelR_rec( p, pFanin, ReqNew - 1 );
    }
}